

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::Generators::IteratorGenerator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>::
IteratorGenerator<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          (IteratorGenerator<std::pair<std::__cxx11::string_const,std::__cxx11::string>> *this,
          _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          first,_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                last)

{
  undefined **local_28;
  char *local_20;
  
  *(undefined ***)this = &PTR__IteratorGenerator_00227b48;
  std::
  vector<std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::
  vector<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,void>
            ((vector<std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)(this + 8),first,last,(allocator_type *)&local_28);
  *(undefined8 *)(this + 0x20) = 0;
  if (*(long *)(this + 8) != *(long *)(this + 0x10)) {
    return;
  }
  local_28 = &PTR__exception_00228cf0;
  local_20 = "IteratorGenerator received no valid values";
  throw_exception<Catch::GeneratorException>((GeneratorException *)&local_28);
}

Assistant:

IteratorGenerator(InputIterator first, InputSentinel last):m_elems(first, last) {
        if (m_elems.empty()) {
            Catch::throw_exception(GeneratorException("IteratorGenerator received no valid values"));
        }
    }